

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_alignment.c
# Opt level: O3

void fsnav_ins_alignment_rotating(void)

{
  undefined1 auVar1 [16];
  fsnav_struct *pfVar2;
  double dVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  char *__nptr;
  long lVar8;
  fsnav_imu *pfVar9;
  double *pdVar10;
  size_t sVar11;
  double *pdVar12;
  long lVar13;
  double (*S) [6];
  long lVar14;
  double (*x) [3];
  double __x;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  bool bVar22;
  char t1_token [10];
  char local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  pfVar2 = fsnav;
  builtin_strncpy(local_58,"alignment",10);
  pfVar9 = fsnav->imu;
  if (pfVar9 == (fsnav_imu *)0x0) {
    return;
  }
  if (fsnav->mode == 0) {
    fsnav_ins_alignment_rotating::t_prev = -1.0;
    fsnav_ins_alignment_rotating::t0 = -1.0;
    fsnav_ins_alignment_rotating::t_shift = 0.0;
    __nptr = fsnav_locate_token(local_58,pfVar9->cfg,pfVar9->cfglength,'=');
    if ((__nptr == (char *)0x0) ||
       (fsnav_ins_alignment_rotating::t1 = atof(__nptr), fsnav_ins_alignment_rotating::t1 <= 0.0)) {
      fsnav_ins_alignment_rotating::t1 = 900.0;
    }
    fsnav_ins_alignment_rotating::L = (fsnav->imu->sol).L;
    return;
  }
  if (fsnav->mode < 0) {
    return;
  }
  dVar17 = pfVar9->t;
  if (fsnav_ins_alignment_rotating::t1 < dVar17) {
    return;
  }
  (pfVar9->sol).L_valid = '\0';
  (pfVar9->sol).q_valid = '\0';
  (pfVar9->sol).rpy_valid = '\0';
  auVar1 = _DAT_0010d060;
  if (pfVar9->w_valid == '\0') {
    return;
  }
  if (pfVar9->f_valid == '\0') {
    return;
  }
  cVar5 = (pfVar9->sol).llh_valid;
  if ((cVar5 == '\0') && ((pfVar2->sol).llh_valid == '\0')) {
    return;
  }
  if (0.0 <= fsnav_ins_alignment_rotating::t_prev) {
    dVar19 = dVar17 - fsnav_ins_alignment_rotating::t_prev;
    if (dVar19 <= 0.0) {
      return;
    }
    fsnav_ins_alignment_rotating::t_shift = dVar17 - fsnav_ins_alignment_rotating::t0;
    __x = fsnav_ins_alignment_rotating::t_shift * (pfVar2->imu_const).u;
    fsnav_ins_alignment_rotating::t_prev = dVar17;
    dVar15 = sin(__x);
    dVar16 = cos(__x);
    fsnav_linal_mmul1T(fsnav_ins_alignment_rotating::fz0,fsnav_ins_alignment_rotating::Azz0,
                       fsnav->imu->f,3,3,1);
    auVar20._0_8_ = 1.0 - dVar16;
    dVar17 = (fsnav->imu_const).u;
    uStack_40 = 0;
    auVar20._8_8_ = dVar15;
    auVar1._8_4_ = SUB84(dVar17,0);
    auVar1._0_8_ = dVar17 * dVar17;
    auVar1._12_4_ = (int)((ulong)dVar17 >> 0x20);
    fsnav_ins_alignment_rotating::hx._0_16_ = divpd(auVar20,auVar1);
    fsnav_ins_alignment_rotating::hx[2] = fsnav_ins_alignment_rotating::t_shift;
    S = fsnav_ins_alignment_rotating::Sx;
    x = fsnav_ins_alignment_rotating::x;
    lVar7 = 0;
    local_48 = auVar20._0_8_;
    do {
      dVar17 = *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar7) * dVar19 +
               *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar7);
      *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar7) = dVar17;
      cVar5 = fsnav_linal_check_measurement_residual
                        (*x,*S,dVar17,fsnav_ins_alignment_rotating::hx,1.0,3.0,3);
      if (cVar5 != '\0') {
        fsnav_linal_kalman_update
                  (*x,*S,fsnav_ins_alignment_rotating::Kx,
                   *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar7),
                   fsnav_ins_alignment_rotating::hx,1.0,3);
      }
      dVar17 = (*x)[1];
      dVar21 = (*x)[2];
      *(double *)((long)fsnav_ins_alignment_rotating::fz0a0 + lVar7) = dVar17 + dVar21;
      *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar7) =
           dVar17 * dVar16 + ((*x)[0] * dVar15) / (fsnav->imu_const).u + dVar21;
      lVar7 = lVar7 + 8;
      S = S + 1;
      x = x + 1;
    } while (lVar7 != 0x18);
    fsnav_linal_mmul(fsnav_ins_alignment_rotating::fza,fsnav_ins_alignment_rotating::Azz0,
                     fsnav_ins_alignment_rotating::fz0,3,3,1);
    dVar17 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::fza,3);
    if (0.0 < dVar17) {
      lVar7 = 0;
      do {
        *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar7) =
             *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar7) / dVar17;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
    }
    lVar7 = 1;
    fsnav_linal_mmul(fsnav_ins_alignment_rotating::fz0,fsnav_ins_alignment_rotating::Azz0,
                     fsnav_ins_alignment_rotating::fz0a0,3,3,1);
    dVar17 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::fz0,3);
    if (0.0 < dVar17) {
      lVar14 = 0;
      do {
        *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar14) =
             *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar14) / dVar17;
        lVar14 = lVar14 + 8;
      } while (lVar14 != 0x18);
    }
    fsnav_ins_alignment_rotating::C[0] = -dVar15;
    fsnav_ins_alignment_rotating::C[1] = local_48 * fsnav_ins_alignment_rotating::slt;
    fsnav_ins_alignment_rotating::C[2] =
         fsnav_ins_alignment_rotating::slt * fsnav_ins_alignment_rotating::slt +
         dVar16 * fsnav_ins_alignment_rotating::clt * fsnav_ins_alignment_rotating::clt;
    lVar14 = 0;
    do {
      dVar17 = fsnav_ins_alignment_rotating::C[1];
      lVar13 = 0;
      if (lVar14 != 0x10) {
        lVar13 = lVar7;
      }
      dVar15 = fsnav_ins_alignment_rotating::fza[lVar13];
      lVar8 = lVar7 + -2;
      if (lVar14 == 0) {
        lVar8 = 2;
      }
      dVar16 = fsnav_ins_alignment_rotating::fza[lVar8];
      *(double *)((long)fsnav_ins_alignment_rotating::hy + lVar14) =
           (dVar15 * dVar15 + dVar16 * dVar16) * fsnav_ins_alignment_rotating::C[1];
      dVar3 = fsnav_ins_alignment_rotating::C[0];
      dVar21 = *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar14);
      fsnav_ins_alignment_rotating::hy[lVar13] =
           dVar16 * fsnav_ins_alignment_rotating::C[0] - dVar15 * dVar21 * dVar17;
      fsnav_ins_alignment_rotating::hy[lVar8] = -dVar15 * dVar3 - dVar16 * dVar21 * dVar17;
      dVar17 = *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar14);
      dVar21 = dVar21 * fsnav_ins_alignment_rotating::C[2];
      dVar15 = sin(__x * 0.5);
      fsnav_linal_kalman_update
                (fsnav_ins_alignment_rotating::y,fsnav_ins_alignment_rotating::Sy,
                 fsnav_ins_alignment_rotating::Ky,dVar15 * (dVar17 - dVar21),
                 fsnav_ins_alignment_rotating::hy,1.0,3);
      lVar14 = lVar14 + 8;
      lVar7 = lVar7 + 1;
    } while (lVar14 != 0x18);
    fsnav_linal_kalman_predict_I_qI(fsnav_ins_alignment_rotating::Sy,9.0 / dVar19,3);
    fsnav_linal_cross3x1
              (fsnav_ins_alignment_rotating::wf,fsnav_ins_alignment_rotating::y,
               fsnav_ins_alignment_rotating::fza);
    dVar17 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::wf,3);
    if (dVar17 <= 0.0) {
      pfVar9 = fsnav->imu;
    }
    else {
      lVar7 = 0;
      pdVar12 = fsnav_ins_alignment_rotating::L;
      do {
        *pdVar12 = *(double *)((long)fsnav_ins_alignment_rotating::wf + lVar7) / dVar17;
        lVar7 = lVar7 + 8;
        pdVar12 = pdVar12 + 3;
      } while (lVar7 != 0x18);
      fsnav_linal_cross3x1
                (fsnav_ins_alignment_rotating::fwf,fsnav_ins_alignment_rotating::fza,
                 fsnav_ins_alignment_rotating::wf);
      pdVar10 = fsnav_ins_alignment_rotating::L;
      pdVar12 = fsnav_ins_alignment_rotating::L + 1;
      lVar7 = 0;
      do {
        *pdVar12 = *(double *)((long)fsnav_ins_alignment_rotating::fwf + lVar7) / dVar17;
        lVar7 = lVar7 + 8;
        pdVar12 = pdVar12 + 3;
      } while (lVar7 != 0x18);
      pdVar12 = pdVar10 + 2;
      lVar7 = 0;
      do {
        *pdVar12 = *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar7);
        lVar7 = lVar7 + 8;
        pdVar12 = pdVar12 + 3;
      } while (lVar7 != 0x18);
      pfVar9 = fsnav->imu;
      (pfVar9->sol).L_valid = '\x01';
      fsnav_linal_mat2quat((pfVar9->sol).q,pdVar10);
      pfVar9 = fsnav->imu;
      (pfVar9->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar9->sol).rpy,fsnav_ins_alignment_rotating::L);
      pfVar9 = fsnav->imu;
      (pfVar9->sol).rpy_valid = '\x01';
    }
    lVar7 = 0;
    do {
      *(double *)((long)fsnav_ins_alignment_rotating::a + lVar7) =
           *(double *)((long)pfVar9->w + lVar7) * dVar19;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x18);
    fsnav_linal_eul2mat(fsnav_ins_alignment_rotating::C,fsnav_ins_alignment_rotating::a);
    lVar7 = 0;
    pdVar12 = fsnav_ins_alignment_rotating::Azz0;
    do {
      lVar14 = 0;
      pdVar10 = pdVar12;
      do {
        *(double *)((long)fsnav_ins_alignment_rotating::a + lVar14) = *pdVar10;
        lVar14 = lVar14 + 8;
        pdVar10 = pdVar10 + 3;
      } while (lVar14 != 0x18);
      pdVar10 = fsnav_ins_alignment_rotating::C;
      lVar14 = 0;
      do {
        dVar17 = 0.0;
        lVar13 = 0;
        do {
          dVar17 = dVar17 + *(double *)((long)pdVar10 + lVar13) *
                            *(double *)((long)fsnav_ins_alignment_rotating::a + lVar13);
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x18);
        fsnav_ins_alignment_rotating::Azz0[lVar14 * 3 + lVar7] = dVar17;
        lVar14 = lVar14 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar14 != 3);
      lVar7 = lVar7 + 1;
      pdVar12 = pdVar12 + 1;
    } while (lVar7 != 3);
    pfVar9 = fsnav->imu;
    (pfVar9->sol).v[0] = 0.0;
    (pfVar9->sol).v[1] = 0.0;
    (pfVar9->sol).v[2] = 0.0;
    (pfVar9->sol).v_valid = '\x01';
    return;
  }
  uVar6 = 0;
  auVar18 = _DAT_0010d050;
  fsnav_ins_alignment_rotating::t_prev = dVar17;
  fsnav_ins_alignment_rotating::t0 = dVar17;
  do {
    bVar22 = SUB164(auVar18 ^ auVar1,4) == -0x80000000 && SUB164(auVar18 ^ auVar1,0) < -0x7ffffff7;
    if (bVar22) {
      dVar17 = 1.0;
      if ((uVar6 & 2) != 0) {
        dVar17 = 0.0;
      }
      fsnav_ins_alignment_rotating::Azz0[uVar6] = dVar17;
    }
    if (bVar22) {
      fsnav_ins_alignment_rotating::Azz0[uVar6 + 1] = 0.0;
    }
    uVar6 = uVar6 + 2;
    lVar7 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 2;
    auVar18._8_8_ = lVar7 + 2;
  } while (uVar6 != 10);
  fsnav_ins_alignment_rotating::x[2][0] = 0.0;
  fsnav_ins_alignment_rotating::x[2][1] = 0.0;
  fsnav_ins_alignment_rotating::x[1][1] = 0.0;
  fsnav_ins_alignment_rotating::x[1][2] = 0.0;
  fsnav_ins_alignment_rotating::x[0][2] = 0.0;
  fsnav_ins_alignment_rotating::x[1][0] = 0.0;
  fsnav_ins_alignment_rotating::x[0][0] = 0.0;
  fsnav_ins_alignment_rotating::x[0][1] = 0.0;
  fsnav_ins_alignment_rotating::x[2][2] = 0.0;
  lVar7 = 0;
  do {
    fsnav_ins_alignment_rotating::vz0[lVar7] = 0.0;
    lVar14 = 3;
    sVar11 = 0x10;
    uVar6 = 0;
    do {
      fsnav_ins_alignment_rotating::Sx[lVar7][uVar6] = 9000000000.0;
      uVar4 = uVar6 + 1;
      if (uVar6 + 1 < uVar6 + lVar14) {
        memset((void *)(lVar7 * 0x30 + 0x111808 + uVar6 * 8),0,sVar11);
        uVar4 = uVar6 + lVar14;
      }
      uVar6 = uVar4;
      sVar11 = sVar11 - 8;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 3;
  sVar11 = 0x10;
  pdVar12 = fsnav_ins_alignment_rotating::y;
  uVar6 = 0;
  do {
    *pdVar12 = 0.0;
    fsnav_ins_alignment_rotating::Sy[uVar6] = 9000000000.0;
    uVar4 = uVar6 + 1;
    if (uVar6 + 1 < uVar6 + lVar7) {
      memset(fsnav_ins_alignment_rotating::Sy + uVar6 + 1,0,sVar11);
      uVar4 = uVar6 + lVar7;
    }
    uVar6 = uVar4;
    sVar11 = sVar11 - 8;
    pdVar12 = pdVar12 + 1;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  if (cVar5 == '\0') {
    if ((pfVar2->sol).llh_valid == '\0') {
      return;
    }
    fsnav_ins_alignment_rotating::slt = sin((pfVar2->sol).llh[1]);
    dVar17 = (fsnav->sol).llh[1];
  }
  else {
    fsnav_ins_alignment_rotating::slt = sin((pfVar9->sol).llh[1]);
    dVar17 = (fsnav->imu->sol).llh[1];
  }
  fsnav_ins_alignment_rotating::clt = cos(dVar17);
  return;
}

Assistant:

void fsnav_ins_alignment_rotating(void) {

	const char   
		t1_token[] = "alignment"; // alignment duration parameter name in configuration
	const double 
		t1_default = 900,         // default alignment duration
		v_std      = 1,           // velocity integral standard deviation
		S0         = 9e9,         // starting covariances
		q2_std     = 9;           // Earth rotation axis ort variance, rad^2/Hz
	const size_t 
		m      = 3;	              // approximation coefficient count

	static double 
		*L		= NULL, // pointer to attitude matrix in solution
		t1      = -1,   // alignment duration
		t_prev  = -1,   // previous time
		t0      = -1,   // alignment start time
		t_shift =  0,   // time since the alignment started
		slt     =  0,   //   sine of latitude
		clt     =  0,   // cosine of latitude
		fz0  [3],       // accelerometers output and their approximation in inertial frame
		vz0  [3],       // velocity integral
		fz0a0[3],       // approximation at t0
		fza  [3],       // approximation at current time in instrumental frame
		a    [3],       // Euler vector of rotation from inertial to instrumental reference frame
		C    [9],       // intermediate transition matrix
		Azz0 [9],       // transition matrix from inertial to instrumental reference frame
		x    [3][3],    // approximation coefficients
		 Sx  [3][6],    // upper-triangular part of Colesky factorization of approximation coefficients covariance
		 Kx  [3],       // approximation Kalman gain
		 hx  [3],       // approximation model matrix
		  y  [3],       // Earth rotation axis ort estimate
		 Sy  [6],       // upper-triangular part of Colesky factorization of Earth rotation axis ort covariance
		 hy  [3],       // Earth rotation axis ort model matrix
		 Ky  [3],       // Earth rotation axis ort Kalman gain
		 wf  [3],       // first column of attitude matrix
		fwf  [3];       // second column of attitude matrix
					    
	double 			    
		   dt,          // time increment
		   ut,          // Earth rotation angle
		  sut, cut,     // sine and cosine of Earth rotation angle
		  n,            // vector norm
		  q2;           // Earth rotation axis ort variance, rad^2
	char *cfg_ptr;      // pointer to a substring in configuration
	size_t 			    
		  i, j, k, k0;  // common indexing variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// reset time variables
		t_prev  = -1;
		t0      = -1;
		t_shift =  0;
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t1_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t1 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t1 <= 0)
			t1 = t1_default;
		// set matrix pointer to imu->sol
		L = fsnav->imu->sol.L;

	}

	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}

	else						// main cycle
	{
		// check if alignment duration exceeded 
		if (fsnav->imu->t > t1)
			return;
		// drop validity flags
		fsnav->imu->sol.L_valid		= 0;
		fsnav->imu->sol.q_valid		= 0;
		fsnav->imu->sol.rpy_valid	= 0;
		// check for crucial data present
		if (   !fsnav->imu->      w_valid     // check if angular rate measurements are available
			|| !fsnav->imu->      f_valid     // check if accelerometer measurements are available
			|| (   !fsnav->imu->sol.llh_valid // check if imu coordinates are available
			    && !fsnav->     sol.llh_valid // check if hybrid solution coordinates are available
			   )
			)
			return;
		// starting procedures
		if (t_prev < 0) {
			// time init
			t_prev = fsnav->imu->t;
			t0     = fsnav->imu->t;
			// identity attitude matrix
			for (i = 0; i < 9; i++)
				Azz0[i] = (i%4 == 0) ? 1 : 0;
			// component-wise init
			for (i = 0; i < 3; i++) {
				// velocity integral
				vz0[i] = 0;
				// starting estimates and covariances for approximation
				for (j = 0, k = 0; j < m; j++) {
					 x[i][j] = 0;
					Sx[i][k] = S0;
					k0 = k + m - j;
					for (k++; k < k0; k++) Sx[i][k] = 0;
				}
			}
			// starting estimates and covariances for Earth rotation axis ort
			for (j = 0, k = 0; j < 3; j++) {
				 y[j] = 0;
				Sy[k] = S0;
				k0 = k + 3 - j;
				for (k++; k < k0; k++) Sy[k] = 0;
			}
			// latitude
			if (fsnav->imu->sol.llh_valid) { // if imu coordinates are available
				slt    = sin(fsnav->imu->sol.llh[1]);
				clt    = cos(fsnav->imu->sol.llh[1]);
			}
			else if (fsnav->sol.llh_valid) { // if hybrid solution coordinates are available
				slt    = sin(fsnav->     sol.llh[1]);
				clt    = cos(fsnav->     sol.llh[1]);
			}
			return;
		}
		// time increments
		dt      = fsnav->imu->t - t_prev; 
		if (dt <= 0) return; // invalid increment, aborting
		t_prev  = fsnav->imu->t;
		t_shift = fsnav->imu->t - t0;
		q2 = q2_std/dt;
		// Earth rotation angle
		 ut = fsnav->imu_const.u*t_shift;
		sut = sin(ut);
		cut = cos(ut);
		// transforming into inertial frame fz0 = A^T*fz
		fsnav_linal_mmul1T(fz0, Azz0, fsnav->imu->f, 3, 3, 1);
		// approximation model coefficients
		hx[0] = (1 - cut)/(fsnav->imu_const.u*fsnav->imu_const.u);  
		hx[1] =   sut    / fsnav->imu_const.u;  
		hx[2] = t_shift;
		// approximation
		for (i = 0; i < 3; i++) {
			// velocity interal update
			vz0[i] += fz0[i]*dt;
			// approiximation coefficient estimates
			if (fsnav_linal_check_measurement_residual(x[i],Sx[i], vz0[i],hx,v_std, 3.0, m)) // check measurement residual within 3-sigma with current estimate
				fsnav_linal_kalman_update(x[i],Sx[i],Kx, vz0[i],hx,v_std, m);                // update estimates using v = h*x + dv, v_std = sqrt(E[dv^2])
			// approximation at t0 in inertial frame
			fz0a0[i] = x[i][1] + x[i][2];
			// approximation at t  in inertial frame
			fz0[i] = x[i][0]*sut/fsnav->imu_const.u + x[i][1]*cut + x[i][2];
		}
		// transition to instrumental frame (fza = Azz0*fz0) and normalization
		fsnav_linal_mmul(fza , Azz0, fz0 , 3, 3, 1);
		n = fsnav_linal_vnorm(fza,3);                    // n = |fza|
		if (n > 0) for (i = 0; i < 3; i++) fza[i] /= n; // normalization
		fsnav_linal_mmul(fz0, Azz0, fz0a0, 3, 3, 1);
		n = fsnav_linal_vnorm(fz0,3);                    // n = |fz0|
		if (n > 0) for (i = 0; i < 3; i++) fz0[i] /= n; // normalization
		// estimating Earth rotation axis ort
		C[0] =        - sut;
		C[1] = slt*(1 - cut);
		C[2] = slt*slt + clt*clt*cut;
		for (i = 0; i < 3; i++) {
			// H = (w x f)*C_13 + [f x (w x f)]*C_23
			hy[(i+0)%3] = (fza[(i+1)%3]*fza[(i+1)%3] + fza[(i+2)%3]*fza[(i+2)%3])*C[1];
			hy[(i+1)%3] =  fza[(i+2)%3]*C[0]         - fza[(i+0)%3]*fza[(i+1)%3] *C[1];
			hy[(i+2)%3] = -fza[(i+1)%3]*C[0]         - fza[(i+0)%3]*fza[(i+2)%3] *C[1];
			fsnav_linal_kalman_update(y,Sy,Ky, (fz0[i]-fza[i]*C[2])*sin(ut/2),hy,1, 3); // update estimate using z = [fza0 - fza*C_33], z = H*y + r, M[r^2] = 1
		}
		// Kalman prediction step, identity transition, diagonal system noise covariance
		fsnav_linal_kalman_predict_I_qI(Sy,q2,3); // P = S*S^T, P_ii = P_ii + q^2, S = chol(P)
		// renew attitude matrix: L = [ (w x f)/|w x f| , (f x (w x f))/(|f||w x f|) , f/|f| ]
		fsnav_linal_cross3x1( wf, y,fza); //  wf =      w x f
		n = fsnav_linal_vnorm(wf,3);      //   n =     |w x f|
		if (n > 0) {
			for (i = 0; i < 3; i++) L[i*3+0] =  wf[i]/n; // L1 =      (w x f) /    |w x f|
			fsnav_linal_cross3x1(fwf,fza,wf); // fwf = f x (w x f)
			for (i = 0; i < 3; i++) L[i*3+1] = fwf[i]/n; // L2 = (f x (w x f))/(|f||w x f|)
			for (i = 0; i < 3; i++) L[i*3+2] = fza[i];   // L3 =           f  / |f|
			fsnav->imu->sol.L_valid = 1;
			// renew quaternion
			fsnav_linal_mat2quat(fsnav->imu->sol.q ,L);
			fsnav->imu->sol.q_valid   = 1;
			// renew angles: roll, pitch and yaw=true heading
			fsnav_linal_mat2rpy(fsnav->imu->sol.rpy,L);
			fsnav->imu->sol.rpy_valid = 1;
		}
		// instrumental frame update: Azz0(t+dt) = (E + [w x]*sin(|w*dt|)/|w| + [w x]^2*(1-cos(|w*dt|)/|w*dt|^2)*Azz0(t) - Rodrigues' rotation formula
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->w[i]*dt; // a = w*dt
		fsnav_linal_eul2mat(C,a);       // C = E + [a x]*sin(|a|)/|a| + [a x]^2*(1-cos(|a|)/|a|^2
		for (i = 0; i < 3; i++) {      // matrix multiplication overwriting Azz0
			for (j = 0; j < 3; j++)
				a[j] = Azz0[j*3+i];    // i-th column of Azz0 previous value
			for (j = 0; j < 3; j++)
				for (k = 0, Azz0[j*3+i] = 0; k < 3; k++)
					Azz0[j*3+i] += C[j*3+k]*a[k]; // replace column with matrix product: Azz0(t+dt) = C*Azz0(t)
		}
		// set velocity equal to zero, with no better information at initial alignment phase
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
	}

}